

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,Range<char> *r)

{
  CharClass<char> *pCVar1;
  Range<char> local_48;
  CharClass<char> local_38;
  Range<char> *local_18;
  Range<char> *r_local;
  CharClass<char> *this_local;
  
  local_18 = r;
  r_local = (Range<char> *)this;
  Range<char>::Range(&local_48,r);
  operator|(&local_38,this,&local_48);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  Range<char>::~Range(&local_48);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }